

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt * __thiscall llvm::APInt::operator+=(APInt *this,APInt *RHS)

{
  uint uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  ulong uVar4;
  APInt *pAVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = this->BitWidth;
  if (uVar1 == RHS->BitWidth) {
    if (uVar1 < 0x41) {
      (this->U).pVal = (uint64_t *)((long)(this->U).pVal + (long)(RHS->U).pVal);
    }
    else {
      puVar2 = (this->U).pVal;
      puVar3 = (RHS->U).pVal;
      uVar6 = 0;
      bVar8 = false;
      do {
        uVar4 = puVar2[uVar6];
        uVar7 = puVar3[uVar6];
        if (bVar8) {
          uVar7 = uVar4 + uVar7 + 1;
          puVar2[uVar6] = uVar7;
          bVar8 = uVar7 <= uVar4;
        }
        else {
          bVar8 = CARRY8(uVar7,uVar4);
          puVar2[uVar6] = uVar7 + uVar4;
        }
        uVar6 = uVar6 + 1;
      } while ((ulong)uVar1 + 0x3f >> 6 != uVar6);
    }
    pAVar5 = clearUnusedBits(this);
    return pAVar5;
  }
  __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0xc1,"APInt &llvm::APInt::operator+=(const APInt &)");
}

Assistant:

APInt& APInt::operator+=(const APInt& RHS) {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord())
    U.VAL += RHS.U.VAL;
  else
    tcAdd(U.pVal, RHS.U.pVal, 0, getNumWords());
  return clearUnusedBits();
}